

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::val::ValidationState_t::GetBitWidth(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  
  uVar2 = GetComponentType(this,id);
  pIVar3 = FindDef(this,uVar2);
  if (pIVar3 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3a0,"uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const");
  }
  uVar1 = (pIVar3->inst_).opcode;
  if (uVar1 - 0x15 < 2) {
    uVar2 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
  }
  else {
    uVar2 = 1;
    if (uVar1 != 0x14) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x3a8,"uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const")
      ;
    }
  }
  return uVar2;
}

Assistant:

uint32_t ValidationState_t::GetBitWidth(uint32_t id) const {
  const uint32_t component_type_id = GetComponentType(id);
  const Instruction* inst = FindDef(component_type_id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeFloat ||
      inst->opcode() == spv::Op::OpTypeInt)
    return inst->word(2);

  if (inst->opcode() == spv::Op::OpTypeBool) return 1;

  assert(0);
  return 0;
}